

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.c
# Opt level: O0

void do_alias(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_RSI;
  long in_RDI;
  int pos;
  string buffer;
  char buf [4608];
  char arg [4608];
  CHAR_DATA *rch;
  CHAR_DATA *in_stack_ffffffffffffd8e8;
  char *in_stack_ffffffffffffd8f0;
  string *this;
  CHAR_DATA *in_stack_ffffffffffffd8f8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffd900;
  size_t *txt;
  char *in_stack_ffffffffffffd910;
  char *in_stack_ffffffffffffd918;
  long local_2688;
  char **local_2680;
  size_t local_2678;
  string local_2670 [32];
  char **local_2650 [2];
  string local_2640 [32];
  undefined4 local_2620;
  int local_260c;
  string local_2608 [32];
  char local_25e8 [312];
  format_args in_stack_ffffffffffffdb50;
  string_view in_stack_ffffffffffffdb60;
  v9 local_13e8 [4616];
  long local_1e0;
  char *local_1d8;
  long local_1d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  local_1c8;
  char local_1a0 [8];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_198;
  char **local_190;
  char (*local_180) [4608];
  v9 *local_178;
  char **local_170;
  size_t sStack_168;
  string *local_160;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  local_158;
  char local_138 [8];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_130;
  char **local_128;
  size_t local_120;
  char (*local_118) [4608];
  v9 *local_110;
  char **local_108;
  size_t sStack_100;
  string *local_f8;
  char *local_f0;
  char ***local_e8;
  char *local_e0;
  char ***local_d8;
  char *local_d0;
  char ***local_c8;
  char *local_c0;
  char ***local_b8;
  char ***local_b0;
  char **local_a8;
  size_t sStack_a0;
  char ***local_90;
  char **local_88;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_70;
  char *local_68;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_60;
  char local_58 [8];
  char *local_50;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_48;
  char *local_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_38;
  char local_30 [8];
  char *local_28;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_20;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_18;
  char *local_10;
  char *local_8;
  
  local_1d8 = in_RSI;
  local_1d0 = in_RDI;
  std::__cxx11::string::string(local_2608);
  smash_tilde(local_1d8);
  if (*(long *)(local_1d0 + 0x80) == 0) {
    local_1e0 = local_1d0;
  }
  else {
    if (*(long *)(*(long *)(local_1d0 + 0x80) + 0x18) == 0) {
      local_2688 = local_1d0;
    }
    else {
      local_2688 = *(long *)(*(long *)(local_1d0 + 0x80) + 0x18);
    }
    local_1e0 = local_2688;
  }
  bVar1 = is_npc(in_stack_ffffffffffffd8e8);
  if (bVar1) {
    local_2620 = 1;
  }
  else {
    local_1d8 = one_argument(in_stack_ffffffffffffd8f0,(char *)in_stack_ffffffffffffd8e8);
    if (local_13e8[0] == (v9)0x0) {
      if (*(long *)(*(long *)(local_1e0 + 0xc0) + 0xa60) == 0) {
        send_to_char(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
        local_2620 = 1;
      }
      else {
        send_to_char(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
        local_260c = 0;
        while (((local_260c < 10 &&
                (*(long *)(*(long *)(local_1e0 + 0xc0) + 0xa60 + (long)local_260c * 8) != 0)) &&
               (*(long *)(*(long *)(local_1e0 + 0xc0) + 0xab0 + (long)local_260c * 8) != 0))) {
          sprintf(local_25e8,"    %s:  %s\n\r",
                  *(undefined8 *)(*(long *)(local_1e0 + 0xc0) + 0xa60 + (long)local_260c * 8),
                  *(undefined8 *)(*(long *)(local_1e0 + 0xc0) + 0xab0 + (long)local_260c * 8));
          send_to_char(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
          local_260c = local_260c + 1;
        }
        local_2620 = 1;
      }
    }
    else {
      bVar1 = str_prefix(in_stack_ffffffffffffd918,in_stack_ffffffffffffd910);
      if ((bVar1) && (bVar1 = str_cmp("alias",(char *)local_13e8), bVar1)) {
        if (*local_1d8 == '\0') {
          local_260c = 0;
          while (((local_260c < 10 &&
                  (*(long *)(*(long *)(local_1e0 + 0xc0) + 0xa60 + (long)local_260c * 8) != 0)) &&
                 (*(long *)(*(long *)(local_1e0 + 0xc0) + 0xab0 + (long)local_260c * 8) != 0))) {
            bVar1 = str_cmp((char *)local_13e8,
                            *(char **)(*(long *)(local_1e0 + 0xc0) + 0xa60 + (long)local_260c * 8));
            if (!bVar1) {
              sprintf(local_25e8,"%s aliases to \'%s\'.\n\r",
                      *(undefined8 *)(*(long *)(local_1e0 + 0xc0) + 0xa60 + (long)local_260c * 8),
                      *(undefined8 *)(*(long *)(local_1e0 + 0xc0) + 0xab0 + (long)local_260c * 8));
              send_to_char(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
              local_2620 = 1;
              goto LAB_005a3f16;
            }
            local_260c = local_260c + 1;
          }
          send_to_char(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
          local_2620 = 1;
        }
        else {
          bVar1 = str_prefix(in_stack_ffffffffffffd918,in_stack_ffffffffffffd910);
          if ((bVar1) &&
             (bVar1 = str_prefix(in_stack_ffffffffffffd918,in_stack_ffffffffffffd910), bVar1)) {
            local_260c = 0;
            while ((local_260c < 10 &&
                   (*(long *)(*(long *)(local_1e0 + 0xc0) + 0xa60 + (long)local_260c * 8) != 0))) {
              bVar1 = str_cmp((char *)local_13e8,
                              *(char **)(*(long *)(local_1e0 + 0xc0) + 0xa60 + (long)local_260c * 8)
                             );
              if (!bVar1) {
                free_pstring(in_stack_ffffffffffffd8f0);
                pcVar2 = palloc_string(in_stack_ffffffffffffd918);
                *(char **)(*(long *)(local_1e0 + 0xc0) + 0xab0 + (long)local_260c * 8) = pcVar2;
                local_e8 = local_2650;
                local_f0 = "{} is now realiased to \'{}\'.\n\r";
                local_c0 = "{} is now realiased to \'{}\'.\n\r";
                local_2650[0] = (char **)0x7cf538;
                local_b8 = local_e8;
                local_120 = std::char_traits<char>::length((char_type *)0x5a3a4d);
                local_10 = local_f0;
                local_f8 = local_2640;
                local_108 = local_2650[0];
                local_110 = local_13e8;
                local_118 = (char (*) [4608])&local_1d8;
                local_b0 = &local_108;
                local_128 = local_2650[0];
                sStack_100 = local_120;
                local_a8 = local_128;
                sStack_a0 = local_120;
                fmt::v9::
                make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608],char*&>
                          (&local_158,local_110,local_118,local_2650[0]);
                local_68 = local_138;
                local_70 = &local_158;
                local_58[0] = -0x34;
                local_58[1] = '\0';
                local_58[2] = '\0';
                local_58[3] = '\0';
                local_58[4] = '\0';
                local_58[5] = '\0';
                local_58[6] = '\0';
                local_58[7] = '\0';
                local_138[0] = -0x34;
                local_138[1] = '\0';
                local_138[2] = '\0';
                local_138[3] = '\0';
                local_138[4] = '\0';
                local_138[5] = '\0';
                local_138[6] = '\0';
                local_138[7] = '\0';
                local_60 = local_70;
                local_50 = local_68;
                local_18 = local_70;
                local_130 = local_70;
                fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb50);
                std::__cxx11::string::operator=(local_2608,local_2640);
                std::__cxx11::string::~string(local_2640);
                std::__cxx11::string::c_str();
                send_to_char(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
                local_2620 = 1;
                goto LAB_005a3f16;
              }
              local_260c = local_260c + 1;
            }
            if (local_260c < 10) {
              pcVar2 = palloc_string(in_stack_ffffffffffffd918);
              *(char **)(*(long *)(local_1e0 + 0xc0) + 0xa60 + (long)local_260c * 8) = pcVar2;
              pcVar2 = palloc_string(pcVar2);
              *(char **)(*(long *)(local_1e0 + 0xc0) + 0xab0 + (long)local_260c * 8) = pcVar2;
              local_d8 = &local_2680;
              local_e0 = "{} is now aliased to \'{}\'.\n\r";
              local_d0 = "{} is now aliased to \'{}\'.\n\r";
              local_2680 = (char **)0x7cf582;
              txt = &local_2678;
              local_c8 = local_d8;
              sVar3 = std::char_traits<char>::length((char_type *)0x5a3d44);
              *txt = sVar3;
              local_8 = local_e0;
              local_160 = local_2670;
              local_170 = local_2680;
              sStack_168 = local_2678;
              local_178 = local_13e8;
              local_180 = (char (*) [4608])&local_1d8;
              local_90 = &local_170;
              local_190 = local_2680;
              local_88 = local_190;
              fmt::v9::
              make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608],char*&>
                        (&local_1c8,local_178,local_180,local_2680);
              local_40 = local_1a0;
              local_48 = &local_1c8;
              local_30[0] = -0x34;
              local_30[1] = '\0';
              local_30[2] = '\0';
              local_30[3] = '\0';
              local_30[4] = '\0';
              local_30[5] = '\0';
              local_30[6] = '\0';
              local_30[7] = '\0';
              local_1a0[0] = -0x34;
              local_1a0[1] = '\0';
              local_1a0[2] = '\0';
              local_1a0[3] = '\0';
              local_1a0[4] = '\0';
              local_1a0[5] = '\0';
              local_1a0[6] = '\0';
              local_1a0[7] = '\0';
              local_38 = local_48;
              local_28 = local_40;
              local_20 = local_48;
              local_198 = local_48;
              fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb50);
              ch_00 = (CHAR_DATA *)local_2608;
              this = local_2670;
              std::__cxx11::string::operator=((string *)ch_00,this);
              std::__cxx11::string::~string(this);
              std::__cxx11::string::c_str();
              send_to_char((char *)txt,ch_00);
              local_2620 = 0;
            }
            else {
              send_to_char(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
              local_2620 = 1;
            }
          }
          else {
            send_to_char(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
            local_2620 = 1;
          }
        }
      }
      else {
        send_to_char(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
        local_2620 = 1;
      }
    }
  }
LAB_005a3f16:
  std::__cxx11::string::~string(local_2608);
  return;
}

Assistant:

void do_alias(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *rch;
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	std::string buffer;
	int pos;
	smash_tilde(argument);

	if (ch->desc == nullptr)
		rch = ch;
	else
		rch = ch->desc->original ? ch->desc->original : ch;

	if (is_npc(rch))
		return;

	argument = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		if (rch->pcdata->alias[0] == nullptr)
		{
			send_to_char("You have no aliases defined.\n\r", ch);
			return;
		}

		send_to_char("Your current aliases are:\n\r", ch);

		for (pos = 0; pos < MAX_ALIAS; pos++)
		{
			if (rch->pcdata->alias[pos] == nullptr || rch->pcdata->alias_sub[pos] == nullptr)
				break;

			sprintf(buf, "    %s:  %s\n\r", rch->pcdata->alias[pos], rch->pcdata->alias_sub[pos]);
			send_to_char(buf, ch);
		}

		return;
	}

	if (!str_prefix("una", arg) || !str_cmp("alias", arg))
	{
		send_to_char("Sorry, that word is reserved.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		for (pos = 0; pos < MAX_ALIAS; pos++)
		{
			if (rch->pcdata->alias[pos] == nullptr || rch->pcdata->alias_sub[pos] == nullptr)
				break;

			if (!str_cmp(arg, rch->pcdata->alias[pos]))
			{
				sprintf(buf, "%s aliases to '%s'.\n\r", rch->pcdata->alias[pos], rch->pcdata->alias_sub[pos]);
				send_to_char(buf, ch);
				return;
			}
		}

		send_to_char("That alias is not defined.\n\r", ch);
		return;
	}

	if (!str_prefix(argument, "delete") || !str_prefix(argument, "prefix"))
	{
		send_to_char("That shall not be done!\n\r", ch);
		return;
	}

	for (pos = 0; pos < MAX_ALIAS; pos++)
	{
		if (rch->pcdata->alias[pos] == nullptr)
			break;

		if (!str_cmp(arg, rch->pcdata->alias[pos])) /* redefine an alias */
		{
			free_pstring(rch->pcdata->alias_sub[pos]);
			rch->pcdata->alias_sub[pos] = palloc_string(argument);

			buffer = fmt::format("{} is now realiased to '{}'.\n\r", arg, argument); //TODO: change the rest of the sprintf calls to format
			send_to_char(buffer.c_str(), ch);
			return;
		}
	}

	if (pos >= MAX_ALIAS)
	{
		send_to_char("Sorry, you have reached the alias limit.\n\r", ch);
		return;
	}

	/* make a new alias */
	rch->pcdata->alias[pos] = palloc_string(arg);
	rch->pcdata->alias_sub[pos] = palloc_string(argument);

	buffer = fmt::format("{} is now aliased to '{}'.\n\r", arg, argument);
	send_to_char(buffer.c_str(), ch);
}